

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpDocHead(xmlDebugCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlDocPtr doc_local;
  xmlDebugCtxtPtr ctxt_local;
  
  if (doc == (xmlDocPtr)0x0) {
    if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"DOCUMENT == NULL !\n");
    }
  }
  else {
    ctxt->node = (xmlNodePtr)doc;
    switch(doc->type) {
    case XML_ELEMENT_NODE:
      xmlDebugErr(ctxt,5000,"Misplaced ELEMENT node\n");
      break;
    case XML_ATTRIBUTE_NODE:
      xmlDebugErr(ctxt,0x1389,"Misplaced ATTRIBUTE node\n");
      break;
    case XML_TEXT_NODE:
      xmlDebugErr(ctxt,0x138a,"Misplaced TEXT node\n");
      break;
    case XML_CDATA_SECTION_NODE:
      xmlDebugErr(ctxt,0x138b,"Misplaced CDATA node\n");
      break;
    case XML_ENTITY_REF_NODE:
      xmlDebugErr(ctxt,0x138c,"Misplaced ENTITYREF node\n");
      break;
    case XML_ENTITY_NODE:
      xmlDebugErr(ctxt,0x138d,"Misplaced ENTITY node\n");
      break;
    case XML_PI_NODE:
      xmlDebugErr(ctxt,0x138e,"Misplaced PI node\n");
      break;
    case XML_COMMENT_NODE:
      xmlDebugErr(ctxt,0x138f,"Misplaced COMMENT node\n");
      break;
    case XML_DOCUMENT_NODE:
      if (ctxt->check == 0) {
        fprintf((FILE *)ctxt->output,"DOCUMENT\n");
      }
      break;
    case XML_DOCUMENT_TYPE_NODE:
      xmlDebugErr(ctxt,0x1390,"Misplaced DOCTYPE node\n");
      break;
    case XML_DOCUMENT_FRAG_NODE:
      xmlDebugErr(ctxt,0x1391,"Misplaced FRAGMENT node\n");
      break;
    case XML_NOTATION_NODE:
      xmlDebugErr(ctxt,0x1392,"Misplaced NOTATION node\n");
      break;
    case XML_HTML_DOCUMENT_NODE:
      if (ctxt->check == 0) {
        fprintf((FILE *)ctxt->output,"HTML DOCUMENT\n");
      }
      break;
    default:
      xmlDebugErr2(ctxt,0x1393,"Unknown node type %d\n",doc->type);
    }
  }
  return;
}

Assistant:

static void
xmlCtxtDumpDocHead(xmlDebugCtxtPtr ctxt, xmlDocPtr doc)
{
    if (doc == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "DOCUMENT == NULL !\n");
        return;
    }
    ctxt->node = (xmlNodePtr) doc;

    switch (doc->type) {
        case XML_ELEMENT_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_ELEMENT,
	                "Misplaced ELEMENT node\n");
            break;
        case XML_ATTRIBUTE_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_ATTRIBUTE,
	                "Misplaced ATTRIBUTE node\n");
            break;
        case XML_TEXT_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_TEXT,
	                "Misplaced TEXT node\n");
            break;
        case XML_CDATA_SECTION_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_CDATA,
	                "Misplaced CDATA node\n");
            break;
        case XML_ENTITY_REF_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_ENTITYREF,
	                "Misplaced ENTITYREF node\n");
            break;
        case XML_ENTITY_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_ENTITY,
	                "Misplaced ENTITY node\n");
            break;
        case XML_PI_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_PI,
	                "Misplaced PI node\n");
            break;
        case XML_COMMENT_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_COMMENT,
	                "Misplaced COMMENT node\n");
            break;
        case XML_DOCUMENT_NODE:
	    if (!ctxt->check)
		fprintf(ctxt->output, "DOCUMENT\n");
            break;
        case XML_HTML_DOCUMENT_NODE:
	    if (!ctxt->check)
		fprintf(ctxt->output, "HTML DOCUMENT\n");
            break;
        case XML_DOCUMENT_TYPE_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_DOCTYPE,
	                "Misplaced DOCTYPE node\n");
            break;
        case XML_DOCUMENT_FRAG_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_FRAGMENT,
	                "Misplaced FRAGMENT node\n");
            break;
        case XML_NOTATION_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_NOTATION,
	                "Misplaced NOTATION node\n");
            break;
        default:
	    xmlDebugErr2(ctxt, XML_CHECK_UNKNOWN_NODE,
	                "Unknown node type %d\n", doc->type);
    }
}